

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)57,(moira::Mode)8,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  Ea<(moira::Mode)8,_1> dst;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  local_34 = (*this->_vptr_Moira[6])(this);
  local_34 = local_34 & 0xffff;
  uVar8 = local_34 << 0x10;
  *addr = *addr + 2;
  uVar6 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar6 & 0xffff | uVar8;
  if (str->style->syntax == MUSASHI) {
    cVar4 = 'e';
    lVar7 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "eori"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = 'b';
    }
    else {
      cVar4 = '.';
      lVar7 = 0;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = ".b"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = '#';
    StrWriter::operator<<(str,(UInt)(uVar5 & 0xff));
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ',';
    SVar2 = str->style->syntax;
    if ((MUSASHI < SVar2) || (cVar4 = ' ', (0x13U >> (SVar2 & 0x1f) & 1) == 0)) goto LAB_0020db6b;
  }
  else {
    cVar4 = 'e';
    lVar7 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "eori"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = 'b';
    }
    else {
      cVar4 = '.';
      lVar7 = 0;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = ".b"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = '#';
    StrWriter::operator<<(str,(Int)(int)(char)uVar5);
    cVar4 = ',';
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = cVar4;
LAB_0020db6b:
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_1> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << dst;
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << "," << dst;
    }
}